

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmainwindowlayout.cpp
# Opt level: O3

bool __thiscall QDockWidgetGroupWindow::hasVisibleDockWidgets(QDockWidgetGroupWindow *this)

{
  long lVar1;
  QList<QDockWidget_*> *__range1;
  long in_FS_OFFSET;
  bool bVar2;
  bool bVar3;
  QList<QDockWidget_*> list;
  QArrayData *local_38;
  long lStack_30;
  long local_28;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  local_38 = (QArrayData *)0x0;
  lStack_30 = 0;
  local_28 = 0;
  bVar2 = false;
  qt_qFindChildren_helper(this,0,0,&QDockWidget::staticMetaObject,&local_38,1);
  if (local_28 != 0) {
    lVar1 = 0;
    do {
      bVar2 = (*(byte *)(*(long *)(*(long *)(lStack_30 + lVar1) + 0x20) + 10) & 1) == 0;
      if (bVar2) break;
      bVar3 = local_28 * 8 + -8 != lVar1;
      lVar1 = lVar1 + 8;
    } while (bVar3);
  }
  if (local_38 != (QArrayData *)0x0) {
    LOCK();
    (local_38->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_38->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_38->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_38,8,0x10);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return bVar2;
  }
  __stack_chk_fail();
}

Assistant:

bool QDockWidgetGroupWindow::hasVisibleDockWidgets() const
{
    const auto &children = findChildren<QDockWidget *>(Qt::FindChildrenRecursively);
    for (auto child : children) {
        // WA_WState_Visible is set on the dock widget, associated to the active tab
        // and unset on all others.
        // WA_WState_Hidden is set if the dock widgets have been explicitly hidden.
        // This is the relevant information to check (equivalent to !child->isHidden()).
        if (!child->testAttribute(Qt::WA_WState_Hidden))
            return true;
    }
    return false;
}